

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.h
# Opt level: O1

string * __thiscall
pstack::stringify<char_const(&)[16],pstack::Dwarf::Tag,char_const(&)[2]>
          (string *__return_storage_ptr__,pstack *this,char (*things) [16],Tag *things_1,
          char (*things_2) [2])

{
  size_t sVar1;
  ostream *poVar2;
  ostringstream local_1a8 [8];
  ostringstream stream;
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  sVar1 = strlen((char *)this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)this,sVar1);
  poVar2 = (ostream *)std::ostream::operator<<(local_1a8,*(int *)*things);
  sVar1 = strlen((char *)things_1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)things_1,sVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string
stringify(Stuff&&... things)
{
    std::ostringstream stream;
    ( stream <<  ... << things );
    return stream.str();
}